

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PPRF_compute_all_keys(vector<GGMNode,_std::allocator<GGMNode>_> *node_list,int level)

{
  undefined4 uVar1;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  long lVar2;
  undefined1 uVar9;
  bool bVar10;
  reference pGVar11;
  mapped_type puVar12;
  mapped_type *ppuVar13;
  double dVar14;
  __type _Var15;
  long local_90;
  long local_88;
  _Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false> local_80;
  long local_78;
  _Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false> local_70;
  undefined8 local_68;
  uint8_t derive_key [16];
  int offset;
  int i;
  GGMNode node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<GGMNode,_std::allocator<GGMNode>_> *__range1;
  int level_local;
  vector<GGMNode,_std::allocator<GGMNode>_> *node_list_local;
  undefined4 uVar4;
  undefined3 uVar6;
  undefined2 uVar8;
  
  __end1 = std::vector<GGMNode,_std::allocator<GGMNode>_>::begin(node_list);
  node._24_8_ = std::vector<GGMNode,_std::allocator<GGMNode>_>::end(node_list);
  while (bVar10 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<const_GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>
                                      *)(node.key + 0xc)), bVar10) {
    pGVar11 = __gnu_cxx::
              __normal_iterator<const_GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>::
              operator*(&__end1);
    lVar2 = pGVar11->index;
    uVar1 = pGVar11->level;
    uVar3 = pGVar11->key[0];
    uVar5 = pGVar11->key[1];
    uVar7 = pGVar11->key[2];
    uVar9 = pGVar11->key[3];
    uVar8 = CONCAT11(uVar9,uVar7);
    uVar6 = CONCAT21(uVar8,uVar5);
    uVar4 = CONCAT31(uVar6,uVar3);
    node.level = (int)*(undefined8 *)(pGVar11->key + 4);
    node.key._0_4_ = SUB84((ulong)*(undefined8 *)(pGVar11->key + 4) >> 0x20,0);
    node.key._4_4_ = SUB84(*(undefined8 *)(pGVar11->key + 0xc),0);
    node.key._8_4_ = SUB84((ulong)*(undefined8 *)(pGVar11->key + 0xc) >> 0x20,0);
    derive_key[0xc] = '\0';
    derive_key[0xd] = '\0';
    derive_key[0xe] = '\0';
    derive_key[0xf] = '\0';
    node.index._0_4_ = uVar1;
    node.index._4_4_ = uVar4;
    for (; dVar14 = (double)(int)derive_key._12_4_,
        _Var15 = std::pow<int,int>(2,level - (int)node.index), dVar14 < _Var15;
        derive_key._12_4_ = derive_key._12_4_ + 1) {
      derive_key._8_4_ =
           (int)(lVar2 << ((char)level - (char)(int)node.index & 0x3fU)) + derive_key._12_4_;
      local_68 = CONCAT44(node.level,node.index._4_4_);
      derive_key[4] = node.key[4];
      derive_key[5] = node.key[5];
      derive_key[6] = node.key[6];
      derive_key[7] = node.key[7];
      derive_key[0] = node.key[0];
      derive_key[1] = node.key[1];
      derive_key[2] = node.key[2];
      derive_key[3] = node.key[3];
      GGMTree::derive_key_from_tree
                ((uint8_t *)&local_68,(long)(int)derive_key._8_4_,level - (int)node.index,0);
      local_78 = (long)(int)derive_key._8_4_;
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
           ::find(&keys,&local_78);
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
           ::end(&keys);
      bVar10 = std::__detail::operator==(&local_70,&local_80);
      if (bVar10) {
        puVar12 = (mapped_type)malloc(0x10);
        local_88 = (long)(int)derive_key._8_4_;
        ppuVar13 = std::
                   unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
                   ::operator[](&keys,&local_88);
        *ppuVar13 = puVar12;
        local_90 = (long)(int)derive_key._8_4_;
        ppuVar13 = std::
                   unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
                   ::operator[](&keys,&local_90);
        puVar12 = *ppuVar13;
        *(undefined8 *)puVar12 = local_68;
        *(undefined8 *)(puVar12 + 8) = derive_key._0_8_;
      }
    }
    __gnu_cxx::__normal_iterator<const_GGMNode_*,_std::vector<GGMNode,_std::allocator<GGMNode>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void PPRF_compute_all_keys(const vector<GGMNode>& node_list, int level) {
    for(GGMNode node : node_list) {
        for (int i = 0; i < pow(2, level - node.level); ++i) {
            int offset = ((node.index) << (level - node.level)) + i;
            uint8_t derive_key[AES_BLOCK_SIZE];
            memcpy(derive_key, node.key, AES_BLOCK_SIZE);
            GGMTree::derive_key_from_tree(derive_key,  offset, level - node.level, 0);
            if(keys.find(offset) == keys.end()) {
                keys[offset] = (uint8_t*) malloc(AES_BLOCK_SIZE);
                memcpy(keys[offset], derive_key, AES_BLOCK_SIZE);
//                for (int j = 0 ; j <16; ++j){
//                    printf ( "%02x ",keys[offset][j]);
//                }
//                cout << endl;
            }
        }
    }
}